

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O2

bool __thiscall
Qentem::Value<char16_t>::
CopyValueTo<Qentem::StringStream<char16_t>,void(Qentem::StringStream<char16_t>&,char16_t_const*,unsigned_int)>
          (Value<char16_t> *this,StringStream<char16_t> *stream,RealFormatInfo format,
          _func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *string_function)

{
  uint uVar1;
  char16_t *pcVar2;
  void *pvStack_10;
  
LAB_00110aec:
  switch(this->type_) {
  case ValuePtr:
    goto switchD_00110b01_caseD_1;
  default:
    return false;
  case String:
    pcVar2 = (this->field_0).string_.storage_;
    uVar1 = (this->field_0).array_.index_;
    pvStack_10 = (void *)(ulong)uVar1;
    if (string_function != (_func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *)0x0) {
      (*string_function)(stream,pcVar2,uVar1);
      return true;
    }
    goto LAB_00110b76;
  case UIntLong:
    Digit::NumberToString<false,Qentem::StringStream<char16_t>,unsigned_long_long>
              (stream,(unsigned_long_long)(this->field_0).array_.storage_,(RealFormatInfo)0x6);
    return true;
  case IntLong:
    Digit::NumberToString<false,Qentem::StringStream<char16_t>,long_long>
              (stream,(longlong)(this->field_0).array_.storage_,(RealFormatInfo)0x6);
    return true;
  case Double:
    Digit::realToString<double,Qentem::StringStream<char16_t>,unsigned_long_long>
              ((Digit *)stream,(StringStream<char16_t> *)(this->field_0).array_.storage_,
               (unsigned_long_long)format,(RealFormatInfo)string_function);
    return true;
  case True:
    pcVar2 = L"true";
    break;
  case False:
    pcVar2 = L"false";
    pvStack_10 = (void *)0x5;
    goto LAB_00110b76;
  case Null:
    pcVar2 = L"null";
  }
  pvStack_10 = (void *)0x4;
LAB_00110b76:
  StringStream<char16_t>::write(stream,(int)pcVar2,pvStack_10,(size_t)string_function);
  return true;
switchD_00110b01_caseD_1:
  this = (this->field_0).array_.storage_;
  goto LAB_00110aec;
}

Assistant:

bool CopyValueTo(StringStream_T             &stream,
                     const Digit::RealFormatInfo format          = Digit::RealFormatInfo{Config::DoublePrecision},
                     StringFunction_T           *string_function = nullptr) const {
        switch (Type()) {
            case ValueType::String: {
                if (string_function != nullptr) {
                    string_function(stream, string_.First(), string_.Length());
                } else {
                    stream.Write(string_.First(), string_.Length());
                }

                break;
            }

            case ValueType::UIntLong: {
                Digit::NumberToString(stream, number_.Natural);
                break;
            }

            case ValueType::IntLong: {
                Digit::NumberToString(stream, number_.Integer);
                break;
            }

            case ValueType::Double: {
                Digit::NumberToString(stream, number_.Real, format);
                break;
            }

            case ValueType::True: {
                stream.Write(JSONotation::TrueString, JSONotation::TrueStringLength);
                break;
            }

            case ValueType::False: {
                stream.Write(JSONotation::FalseString, JSONotation::FalseStringLength);
                break;
            }

            case ValueType::Null: {
                stream.Write(JSONotation::NullString, JSONotation::NullStringLength);
                break;
            }

            case ValueType::ValuePtr: {
                return value_->CopyValueTo(stream, format, string_function);
            }

            default: {
                return false;
            }
        }

        return true;
    }